

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestMultiProcessHandler::StartTestProcess(cmCTestMultiProcessHandler *this,int test)

{
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *this_00;
  _Base_ptr __args;
  PropertiesMap *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  const_iterator __position;
  mapped_type pcVar2;
  pointer puVar3;
  pointer puVar4;
  cmCTest *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  pointer pcVar6;
  _Base_ptr __n;
  _Head_base<0UL,_cmCTestRunTest_*,_false> _Var7;
  int iVar8;
  mapped_type *ppcVar9;
  ostream *poVar10;
  mapped_type *pmVar11;
  cmCTestRunTest *this_03;
  mapped_type *__x;
  const_iterator cVar12;
  mapped_type *pmVar13;
  _Rb_tree_header *p_Var14;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
  *this_04;
  mapped_type *pmVar15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  long *plVar18;
  size_type *psVar19;
  string *f;
  ulong uVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__k;
  pointer pvVar21;
  _Head_base<0UL,_cmCTestRunTest_*,_false> *runner;
  char *pcVar22;
  cmCTestTestResourceRequirement *requirement;
  pointer pcVar23;
  size_t __n_00;
  cmCTestMultiProcessHandler *pcVar24;
  bool bVar25;
  __single_object testRun;
  cmWorkingDirectory workdir;
  int local_274;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_270;
  PropertiesMap *local_268;
  cmCTestMultiProcessHandler *local_260;
  string local_258;
  __uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> local_238;
  string local_230;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_210;
  cmCTestResourceAllocator *local_208;
  _Rb_tree_node_base *local_200;
  pointer local_1f8;
  _Head_base<0UL,_cmCTestRunTest_*,_false> local_1f0;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  undefined1 local_1a8 [8];
  pointer puStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  int local_188;
  ios_base local_138 [264];
  
  local_274 = test;
  local_260 = this;
  if (this->HaveAffinity != 0) {
    this_01 = &this->Properties;
    ppcVar9 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&this_01->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_274);
    if ((*ppcVar9)->WantAffinity == true) {
      local_1a8._0_4_ = local_274;
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_01->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type_conflict *)local_1a8);
      __n_00 = (long)(*ppcVar9)->Processors;
      if (this->ParallelLevel < (ulong)(long)(*ppcVar9)->Processors) {
        __n_00 = this->ParallelLevel;
      }
      if (((this->HaveAffinity != 0) && (this->HaveAffinity < __n_00)) &&
         (ppcVar9 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&this_01->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type_conflict *)local_1a8), (*ppcVar9)->WantAffinity != false
         )) {
        __n_00 = this->HaveAffinity;
      }
      if ((this->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_node_count < __n_00) {
        return false;
      }
      local_1a8 = (undefined1  [8])0x0;
      puStack_1a0 = (pointer)0x0;
      local_198._M_allocated_capacity = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1a8,__n_00);
      if (__n_00 != 0) {
        this_00 = &local_260->ProcessorsAvailable;
        do {
          __position._M_node =
               (local_260->ProcessorsAvailable)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
          ;
          __args = __position._M_node + 1;
          if (puStack_1a0 == (pointer)local_198._M_allocated_capacity) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)local_1a8,
                       (iterator)puStack_1a0,(unsigned_long *)__args);
          }
          else {
            *puStack_1a0 = *(unsigned_long *)__args;
            puStack_1a0 = puStack_1a0 + 1;
          }
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                              *)this_00,__position);
          __n_00 = __n_00 - 1;
        } while (__n_00 != 0);
      }
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_01->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_274);
      this = local_260;
      pcVar2 = *ppcVar9;
      puVar3 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar4 = (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_1a8;
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puStack_1a0;
      (pcVar2->Affinity).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_198._M_allocated_capacity;
      local_1a8 = (undefined1  [8])0x0;
      puStack_1a0 = (pointer)0x0;
      local_198._M_allocated_capacity = 0;
      if ((puVar3 != (pointer)0x0) &&
         (operator_delete(puVar3,(long)puVar4 - (long)puVar3), local_1a8 != (undefined1  [8])0x0)) {
        operator_delete((void *)local_1a8,local_198._M_allocated_capacity - (long)local_1a8);
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"test ",5);
  poVar10 = (ostream *)std::ostream::operator<<(local_1a8,local_274);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  this_02 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(this_02,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0xa8,local_258._M_dataplus._M_p,this->Quiet);
  paVar1 = &local_258.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != paVar1) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  pmVar11 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
            operator[](&this->TestRunningMap,&local_274);
  *pmVar11 = true;
  EraseTest(this,local_274);
  local_1a8._0_4_ = local_274;
  local_268 = &this->Properties;
  ppcVar9 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_268->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,(key_type_conflict *)local_1a8);
  uVar20 = (long)(*ppcVar9)->Processors;
  if (this->ParallelLevel < (ulong)(long)(*ppcVar9)->Processors) {
    uVar20 = this->ParallelLevel;
  }
  if (((this->HaveAffinity != 0) && (this->HaveAffinity < uVar20)) &&
     (ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_268->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,(key_type_conflict *)local_1a8), (*ppcVar9)->WantAffinity != false)) {
    uVar20 = this->HaveAffinity;
  }
  this->RunningCount = this->RunningCount + uVar20;
  this_03 = (cmCTestRunTest *)operator_new(0x288);
  cmCTestRunTest::cmCTestRunTest(this_03,this);
  if (this->RepeatMode != Never) {
    this_03->RepeatMode = this->RepeatMode;
    iVar8 = this->RepeatCount;
    this_03->NumberOfRunsLeft = iVar8;
    this_03->NumberOfRunsTotal = iVar8;
  }
  this_03->Index = local_274;
  local_270._M_head_impl = this_03;
  ppcVar9 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&local_268->
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_274);
  _Var7._M_head_impl = local_270._M_head_impl;
  this_03->TestProperties = *ppcVar9;
  if (this->TestHandler->UseResourceSpec == true) {
    (local_270._M_head_impl)->UseAllocatedResources = true;
    __x = std::map<$a129e267$>::operator[](&this->AllocatedResources,&local_274);
    std::
    vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestMultiProcessHandler::ResourceAllocation,_std::allocator<cmCTestMultiProcessHandler::ResourceAllocation>_>_>_>_>_>_>
    ::operator=(&(_Var7._M_head_impl)->AllocatedResources,__x);
  }
  __k = (this->Failed->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (this->Failed->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__k != pbVar5) {
    do {
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_268->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_274);
      pcVar2 = *ppcVar9;
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&(pcVar2->RequireSuccessDepends)._M_t,__k);
      if ((_Rb_tree_header *)cVar12._M_node !=
          &(pcVar2->RequireSuccessDepends)._M_t._M_impl.super__Rb_tree_header) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&(local_270._M_head_impl)->FailedDependencies,__k);
      }
      __k = __k + 1;
    } while (__k != pbVar5);
  }
  pcVar24 = local_260;
  LockResources(local_260,local_274);
  pmVar13 = std::
            map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
            ::operator[](&pcVar24->ResourceAllocationErrors,&local_274);
  if ((pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ppcVar9 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_268->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_274);
    cmWorkingDirectory::cmWorkingDirectory((cmWorkingDirectory *)local_1a8,&(*ppcVar9)->Directory);
    if (local_188 == 0) {
      runner = &local_1f0;
      local_1f0._M_head_impl = local_270._M_head_impl;
      local_270._M_head_impl = (cmCTestRunTest *)0x0;
      bVar25 = cmCTestRunTest::StartTest
                         ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner
                          ,pcVar24->Completed,pcVar24->Total);
    }
    else {
      local_210._M_head_impl = local_270._M_head_impl;
      local_270._M_head_impl = (cmCTestRunTest *)0x0;
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&local_268->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,&local_274);
      std::operator+(&local_1c8,"Failed to change working directory to ",&(*ppcVar9)->Directory);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      psVar19 = (size_type *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_230.field_2._M_allocated_capacity = *psVar19;
        local_230.field_2._8_8_ = plVar18[3];
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      }
      else {
        local_230.field_2._M_allocated_capacity = *psVar19;
        local_230._M_dataplus._M_p = (pointer)*plVar18;
      }
      local_230._M_string_length = plVar18[1];
      *plVar18 = (long)psVar19;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      strerror(local_188);
      plVar18 = (long *)std::__cxx11::string::append((char *)&local_230);
      psVar19 = (size_type *)(plVar18 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar18 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_258.field_2._M_allocated_capacity = *psVar19;
        local_258.field_2._8_4_ = (undefined4)plVar18[3];
        local_258.field_2._12_4_ = *(undefined4 *)((long)plVar18 + 0x1c);
        local_258._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_258.field_2._M_allocated_capacity = *psVar19;
        local_258._M_dataplus._M_p = (pointer)*plVar18;
      }
      local_258._M_string_length = plVar18[1];
      *plVar18 = (long)psVar19;
      plVar18[1] = 0;
      *(undefined1 *)(plVar18 + 2) = 0;
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,"Failed to change working directory","");
      runner = &local_210;
      cmCTestRunTest::StartFailure
                ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner,
                 &local_258,&local_1e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != paVar1) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      bVar25 = false;
    }
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)runner);
    cmWorkingDirectory::~cmWorkingDirectory((cmWorkingDirectory *)local_1a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Insufficient resources for test ",0x20);
    ppcVar9 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&local_268->
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_274);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,((*ppcVar9)->Name)._M_dataplus._M_p,
                         ((*ppcVar9)->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,":\n\n",3);
    pmVar13 = std::
              map<int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestMultiProcessHandler::ResourceAllocationError>_>_>_>_>_>
              ::operator[](&pcVar24->ResourceAllocationErrors,&local_274);
    p_Var17 = (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &(pmVar13->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var17 != p_Var14) {
      local_208 = &pcVar24->ResourceAllocator;
      local_200 = &p_Var14->_M_header;
      do {
        if (p_Var17[2]._M_color == _S_black) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Test requested resources of type \'",0x24);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)(p_Var17 + 1),
                               (long)p_Var17[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\' in the following amounts:\n",0x1c);
          ppcVar9 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&local_268->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,&local_274);
          pvVar21 = ((*ppcVar9)->ResourceGroups).
                    super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1f8 = ((*ppcVar9)->ResourceGroups).
                      super__Vector_base<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>,_std::allocator<std::vector<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          if (pvVar21 != local_1f8) {
            do {
              pcVar6 = (pvVar21->
                       super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pcVar23 = (pvVar21->
                             super__Vector_base<cmCTestTestHandler::cmCTestTestResourceRequirement,_std::allocator<cmCTestTestHandler::cmCTestTestResourceRequirement>_>
                             )._M_impl.super__Vector_impl_data._M_start; pcVar23 != pcVar6;
                  pcVar23 = pcVar23 + 1) {
                __n = (_Base_ptr)(pcVar23->ResourceType)._M_string_length;
                if ((__n == p_Var17[1]._M_parent) &&
                   ((__n == (_Base_ptr)0x0 ||
                    (iVar8 = bcmp((pcVar23->ResourceType)._M_dataplus._M_p,*(void **)(p_Var17 + 1),
                                  (size_t)__n), iVar8 == 0)))) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
                  poVar10 = (ostream *)
                            std::ostream::operator<<((ostream *)local_1a8,pcVar23->SlotsNeeded);
                  bVar25 = pcVar23->SlotsNeeded == 1;
                  pcVar22 = " slots\n";
                  if (bVar25) {
                    pcVar22 = " slot\n";
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,pcVar22,(ulong)bVar25 ^ 7);
                }
              }
              pvVar21 = pvVar21 + 1;
            } while (pvVar21 != local_1f8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  but only the following units were available:\n",0x2f);
          pcVar24 = local_260;
          this_04 = cmCTestResourceAllocator::GetResources_abi_cxx11_(local_208);
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestResourceAllocator::Resource>_>_>_>_>_>
                    ::at(this_04,(key_type *)(p_Var17 + 1));
          for (p_Var16 = (pmVar15->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var16 != &(pmVar15->_M_t)._M_impl.super__Rb_tree_header;
              p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    \'",5);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,*(char **)(p_Var16 + 1),
                                 (long)p_Var16[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\': ",3);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            bVar25 = p_Var16[2]._M_color == _S_black;
            pcVar22 = " slots\n";
            if (bVar25) {
              pcVar22 = " slot\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar22,(ulong)bVar25 ^ 7);
          }
        }
        else if (p_Var17[2]._M_color == _S_red) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"  Test requested resources of type \'",0x24);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,*(char **)(p_Var17 + 1),
                               (long)p_Var17[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"\' which does not exist\n",0x17);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
      } while (p_Var17 != local_200);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Resource spec file:\n\n  ",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(pcVar24->TestHandler->ResourceSpecFile)._M_dataplus._M_p,
               (pcVar24->TestHandler->ResourceSpecFile)._M_string_length);
    local_238._M_t.super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
    super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl =
         (tuple<cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>)
         (tuple<cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>)local_270._M_head_impl;
    local_270._M_head_impl = (cmCTestRunTest *)0x0;
    std::__cxx11::stringbuf::str();
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_230,"Insufficient resources","");
    cmCTestRunTest::StartFailure
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_238,
               &local_258,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
              ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_238);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    bVar25 = false;
  }
  std::unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>::~unique_ptr
            ((unique_ptr<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_> *)&local_270);
  return bVar25;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTestProcess(int test)
{
  if (this->HaveAffinity && this->Properties[test]->WantAffinity) {
    size_t needProcessors = this->GetProcessorsUsed(test);
    if (needProcessors > this->ProcessorsAvailable.size()) {
      return false;
    }
    std::vector<size_t> affinity;
    affinity.reserve(needProcessors);
    for (size_t i = 0; i < needProcessors; ++i) {
      auto p = this->ProcessorsAvailable.begin();
      affinity.push_back(*p);
      this->ProcessorsAvailable.erase(p);
    }
    this->Properties[test]->Affinity = std::move(affinity);
  }

  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "test " << test << "\n", this->Quiet);
  this->TestRunningMap[test] = true; // mark the test as running
  // now remove the test itself
  this->EraseTest(test);
  this->RunningCount += this->GetProcessorsUsed(test);

  auto testRun = cm::make_unique<cmCTestRunTest>(*this);

  if (this->RepeatMode != cmCTest::Repeat::Never) {
    testRun->SetRepeatMode(this->RepeatMode);
    testRun->SetNumberOfRuns(this->RepeatCount);
  }
  testRun->SetIndex(test);
  testRun->SetTestProperties(this->Properties[test]);
  if (this->TestHandler->UseResourceSpec) {
    testRun->SetUseAllocatedResources(true);
    testRun->SetAllocatedResources(this->AllocatedResources[test]);
  }

  // Find any failed dependencies for this test. We assume the more common
  // scenario has no failed tests, so make it the outer loop.
  for (std::string const& f : *this->Failed) {
    if (cm::contains(this->Properties[test]->RequireSuccessDepends, f)) {
      testRun->AddFailedDependency(f);
    }
  }

  // Always lock the resources we'll be using, even if we fail to set the
  // working directory because FinishTestProcess() will try to unlock them
  this->LockResources(test);

  if (!this->ResourceAllocationErrors[test].empty()) {
    std::ostringstream e;
    e << "Insufficient resources for test " << this->Properties[test]->Name
      << ":\n\n";
    for (auto const& it : this->ResourceAllocationErrors[test]) {
      switch (it.second) {
        case ResourceAllocationError::NoResourceType:
          e << "  Test requested resources of type '" << it.first
            << "' which does not exist\n";
          break;

        case ResourceAllocationError::InsufficientResources:
          e << "  Test requested resources of type '" << it.first
            << "' in the following amounts:\n";
          for (auto const& group : this->Properties[test]->ResourceGroups) {
            for (auto const& requirement : group) {
              if (requirement.ResourceType == it.first) {
                e << "    " << requirement.SlotsNeeded
                  << (requirement.SlotsNeeded == 1 ? " slot\n" : " slots\n");
              }
            }
          }
          e << "  but only the following units were available:\n";
          for (auto const& res :
               this->ResourceAllocator.GetResources().at(it.first)) {
            e << "    '" << res.first << "': " << res.second.Total
              << (res.second.Total == 1 ? " slot\n" : " slots\n");
          }
          break;
      }
      e << "\n";
    }
    e << "Resource spec file:\n\n  " << this->TestHandler->ResourceSpecFile;
    cmCTestRunTest::StartFailure(std::move(testRun), e.str(),
                                 "Insufficient resources");
    return false;
  }

  cmWorkingDirectory workdir(this->Properties[test]->Directory);
  if (workdir.Failed()) {
    cmCTestRunTest::StartFailure(std::move(testRun),
                                 "Failed to change working directory to " +
                                   this->Properties[test]->Directory + " : " +
                                   std::strerror(workdir.GetLastResult()),
                                 "Failed to change working directory");
    return false;
  }

  // Ownership of 'testRun' has moved to another structure.
  // When the test finishes, FinishTestProcess will be called.
  return cmCTestRunTest::StartTest(std::move(testRun), this->Completed,
                                   this->Total);
}